

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * fs_get_cache_directory_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  anon_class_1_0_00000001 ensure_trailing_slash;
  string cache_directory;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  string *this;
  char *in_stack_fffffffffffffee8;
  string *this_00;
  string *in_stack_fffffffffffffef0;
  anon_class_1_0_00000001 *in_stack_fffffffffffffef8;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  string local_c8 [32];
  string local_a8 [39];
  anon_class_1_0_00000001 local_81;
  string local_80 [32];
  string local_60 [55];
  allocator<char> local_29;
  string local_28 [40];
  
  __a = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,__a);
  std::allocator<char>::~allocator(&local_29);
  pcVar1 = getenv("LLAMA_CACHE");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = getenv("XDG_CACHE_HOME");
    if (pcVar1 == (char *)0x0) {
      in_stack_fffffffffffffef0 = (string *)getenv("HOME");
      in_stack_fffffffffffffef8 = &local_81;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,__a);
      std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      std::__cxx11::string::operator=(local_28,local_60);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    else {
      pcVar1 = getenv("XDG_CACHE_HOME");
      std::__cxx11::string::operator=(local_28,pcVar1);
    }
    std::__cxx11::string::string(local_c8,local_28);
    fs_get_cache_directory::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    this_00 = local_28;
    this = local_a8;
    std::__cxx11::string::operator=(this_00,this);
    std::__cxx11::string::~string(this);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::operator+=(this_00,"llama.cpp");
  }
  else {
    pcVar1 = getenv("LLAMA_CACHE");
    std::__cxx11::string::operator=(local_28,pcVar1);
  }
  std::__cxx11::string::string((string *)&stack0xffffffffffffff18,local_28);
  fs_get_cache_directory::anon_class_1_0_00000001::operator()
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  std::__cxx11::string::~string(local_28);
  return in_RDI;
}

Assistant:

std::string fs_get_cache_directory() {
    std::string cache_directory = "";
    auto ensure_trailing_slash = [](std::string p) {
        // Make sure to add trailing slash
        if (p.back() != DIRECTORY_SEPARATOR) {
            p += DIRECTORY_SEPARATOR;
        }
        return p;
    };
    if (getenv("LLAMA_CACHE")) {
        cache_directory = std::getenv("LLAMA_CACHE");
    } else {
#if defined(__linux__) || defined(__FreeBSD__) || defined(_AIX)
        if (std::getenv("XDG_CACHE_HOME")) {
            cache_directory = std::getenv("XDG_CACHE_HOME");
        } else {
            cache_directory = std::getenv("HOME") + std::string("/.cache/");
        }
#elif defined(__APPLE__)
        cache_directory = std::getenv("HOME") + std::string("/Library/Caches/");
#elif defined(_WIN32)
        cache_directory = std::getenv("LOCALAPPDATA");
#else
#  error Unknown architecture
#endif
        cache_directory = ensure_trailing_slash(cache_directory);
        cache_directory += "llama.cpp";
    }
    return ensure_trailing_slash(cache_directory);
}